

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_TIMED_INC(effect_handler_context_t_conflict *context)

{
  byte can_disturb;
  wchar_t timer;
  monster *mon;
  loc grid;
  wchar_t wVar1;
  
  timer = effect_calculate_value(context,false);
  mon = monster_target_monster(context);
  grid = cave_find_decoy(cave);
  context->ident = true;
  if (((cave->mon_current < L'\x01') || ((ulong)grid >> 0x20 == 0)) ||
     (((ulong)grid & 0xffffffff) == 0)) {
    if (mon == (monster *)0x0) {
      if (((player->timed[context->subtype] == 0) ||
          (wVar1 = context->other, context->other == L'\0')) && (wVar1 = L'\0', L'\0' < timer)) {
        wVar1 = timer;
      }
      can_disturb = true;
      if ((context->origin).what == SRC_PLAYER) {
        can_disturb = context->aware ^ 1;
      }
      player_inc_timed(player,context->subtype,wVar1,true,(_Bool)can_disturb,true);
    }
    else {
      switch(context->subtype) {
      case 1:
        wVar1 = L'\x04';
        break;
      case 2:
        wVar1 = L'\x01';
        break;
      case 3:
        wVar1 = L'\x06';
        break;
      case 4:
        wVar1 = L'\x02';
        break;
      case 5:
        wVar1 = L'\x03';
        break;
      default:
        if (context->subtype != 0x19) {
          return true;
        }
        wVar1 = L'\0';
      }
      if (timer < L'\x01') {
        timer = L'\0';
      }
      mon_inc_timed(mon,wVar1,timer,L'\0');
    }
  }
  else {
    square_destroy_decoy(cave,grid);
  }
  return true;
}

Assistant:

bool effect_handler_TIMED_INC(effect_handler_context_t *context)
{
	int amount = effect_calculate_value(context, false);
	struct monster *t_mon = monster_target_monster(context);
	struct loc decoy = cave_find_decoy(cave);

	context->ident = true;

	/* Destroy decoy if it's a monster attack */
	if (cave->mon_current > 0 && decoy.y && decoy.x) {
		square_destroy_decoy(cave, decoy);
		return true;
	}

	/* Check for monster targeting another monster */
	if (t_mon) {
		int mon_tmd_effect = -1;

		/* Will do until monster and player timed effects are fused */
		switch (context->subtype) {
			case TMD_CONFUSED: {
				mon_tmd_effect = MON_TMD_CONF;
				break;
			}
			case TMD_SLOW: {
				mon_tmd_effect = MON_TMD_SLOW;
				break;
			}
			case TMD_PARALYZED: {
				mon_tmd_effect = MON_TMD_HOLD;
				break;
			}
			case TMD_BLIND: {
				mon_tmd_effect = MON_TMD_STUN;
				break;
			}
			case TMD_AFRAID: {
				mon_tmd_effect = MON_TMD_FEAR;
				break;
			}
			case TMD_AMNESIA: {
				mon_tmd_effect = MON_TMD_SLEEP;
				break;
			}
			default: {
				break;
			}
		}
		if (mon_tmd_effect >= 0) {
			mon_inc_timed(t_mon, mon_tmd_effect, MAX(amount, 0), 0);
		}
		return true;
	}

	if (!player->timed[context->subtype] || !context->other) {
		player_inc_timed(player, context->subtype, MAX(amount, 0), true,
			context->origin.what != SRC_PLAYER || !context->aware,
			true);
	} else {
		player_inc_timed(player, context->subtype, context->other, true,
			context->origin.what != SRC_PLAYER || !context->aware,
			true);
	}
	return true;
}